

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* __thiscall
sfc::Palette::colors
          (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *__return_storage_ptr__,Palette *this)

{
  bool bVar1;
  rgba_vec_t local_58;
  reference local_40;
  Subpalette *sp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *__range1;
  Palette *this_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *v;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::begin
                     (&this->_subpalettes);
  sp = (Subpalette *)
       std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::end(&this->_subpalettes);
  while (bVar1 = __gnu_cxx::
                 operator==<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                           (&__end1,(__normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                                     *)&sp), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
               ::operator*(&__end1);
    Subpalette::colors(&local_58,local_40);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(__return_storage_ptr__,&local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
    __gnu_cxx::
    __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<rgba_vec_t> Palette::colors() const {
  std::vector<rgba_vec_t> v;
  for (const auto& sp : _subpalettes)
    v.push_back(sp.colors());
  return v;
}